

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::test
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this,Data *data)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar2 = this->m_components;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  do {
    uVar4 = uVar3;
    if (uVar5 == uVar4) break;
    uVar6 = ~(-1 << ((byte)data->bits & 0x1f));
    if (data->bits == 0x20) {
      uVar6 = 0xffffffff;
    }
    bVar1 = (byte)data->offset;
    uVar3 = uVar4 + 1;
  } while (data->outUvec4[uVar4] ==
           ((uVar6 & data->in2Uvec4[uVar4]) << (bVar1 & 0x1f) |
           ~(uVar6 << (bVar1 & 0x1f)) & data->inUvec4[uVar4]));
  return (long)(int)uVar2 <= (long)uVar4;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint mask = (data->bits == 32) ? ~0u : (1 << data->bits) - 1;
			GLuint expected =
				(data->inUvec4[i] & ~(mask << data->offset)) | ((data->in2Uvec4[i] & mask) << data->offset);
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}